

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  i64 iVar2;
  Wal *pWal;
  u32 *puVar3;
  Pager *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  u32 uVar9;
  u32 iPage;
  u32 nTruncate_00;
  long lVar10;
  u8 *p;
  PgHdr **ppPVar11;
  sqlite3_int64 sVar12;
  Pgno nTruncate_01;
  long lVar13;
  long lVar14;
  PgHdr *pPVar15;
  PgHdr *pPVar16;
  long lVar17;
  ulong local_d0;
  PgHdr *local_c0;
  u32 salt1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  uint local_9c;
  undefined8 local_98;
  uint local_90;
  uint local_8c;
  long local_88;
  PgHdr *pList_local;
  sqlite3_file *local_78;
  u8 *local_70;
  u8 *local_68;
  Pager *local_60;
  WalWriter w;
  u32 aCksum [2];
  
  pList_local = pList;
  if (isCommit == 0) {
    iVar5 = 1;
  }
  else {
    ppPVar11 = &pList_local;
    iVar5 = 0;
    for (; *ppPVar11 = pList, pList != (PgHdr *)0x0; pList = pList->pDirty) {
      if (pList->pgno <= nTruncate) {
        ppPVar11 = &pList->pDirty;
      }
      iVar5 = iVar5 + (uint)(pList->pgno <= nTruncate);
    }
  }
  pPVar15 = pList_local;
  pPager->aStat[2] = pPager->aStat[2] + iVar5;
  if (pList_local->pgno == 1) {
    pager_write_changecounter(pList_local);
  }
  iVar2 = pPager->pageSize;
  pWal = pPager->pWal;
  bVar1 = pPager->walSyncFlags;
  puVar3 = *pWal->apWiData;
  iVar5 = bcmp(&pWal->hdr,puVar3,0x30);
  if (iVar5 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = puVar3[4] + 1;
  }
  uVar9 = (u32)iVar2;
  local_60 = pPager;
  if (pWal->readLock == 0) {
    if (puVar3[0x18] == 0) {
LAB_0015b2a1:
      walUnlockShared(pWal,3);
      pWal->readLock = -1;
      iVar8 = 1;
      do {
        iVar5 = walTryBeginRead(pWal,(int *)&salt1,1,iVar8);
        iVar8 = iVar8 + 1;
      } while (iVar5 == -1);
    }
    else {
      sqlite3_randomness(4,&salt1);
      iVar5 = walLockExclusive(pWal,4,4);
      if (iVar5 == 5) goto LAB_0015b2a1;
      if (iVar5 == 0) {
        walRestartHdr(pWal,salt1);
        walUnlockExclusive(pWal,4,4);
        goto LAB_0015b2a1;
      }
    }
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  local_d0 = (ulong)(pWal->hdr).mxFrame;
  if (local_d0 == 0) {
    _salt1 = 0x18e22d0082067f37;
    local_a0 = (undefined1)((ulong)iVar2 >> 0x18);
    local_9f = (undefined1)((ulong)iVar2 >> 0x10);
    local_9e = (undefined1)((ulong)iVar2 >> 8);
    local_9d = (undefined1)iVar2;
    uVar7 = pWal->nCkpt;
    local_9c = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    if (uVar7 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_98 = *(undefined8 *)(pWal->hdr).aSalt;
    walChecksumBytes(1,(u8 *)&salt1,0x18,(u32 *)0x0,aCksum);
    local_90 = aCksum[0] >> 0x18 | (aCksum[0] & 0xff0000) >> 8 | (aCksum[0] & 0xff00) << 8 |
               aCksum[0] << 0x18;
    local_8c = aCksum[1] >> 0x18 | (aCksum[1] & 0xff0000) >> 8 | (aCksum[1] & 0xff00) << 8 |
               aCksum[1] << 0x18;
    pWal->szPage = uVar9;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = aCksum[0];
    (pWal->hdr).aFrameCksum[1] = aCksum[1];
    pWal->truncateOnCommit = '\x01';
    iVar5 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&salt1,0x20,0);
    if (iVar5 != 0) {
      return iVar5;
    }
    if (((pWal->syncHeader != '\0') && ((bVar1 >> 2 & 3) != 0)) &&
       (iVar5 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,bVar1 >> 2 & 3), iVar5 != 0)) {
      return iVar5;
    }
  }
  local_78 = pWal->pWalFd;
  w.iSyncPoint = 0;
  lVar10 = (long)(int)(uVar9 + 0x18);
  lVar17 = local_d0 * lVar10 + 0x20;
  local_c0 = (PgHdr *)0x0;
  w.pWal = pWal;
  w.pFd = local_78;
  w.syncFlags = (uint)bVar1;
  w.szPage = uVar9;
  for (pPVar16 = pPVar15; uVar7 = (uint)local_d0, pPVar16 != (PgHdr *)0x0; pPVar16 = pPVar16->pDirty
      ) {
    if (uVar6 == 0) {
LAB_0015b1c6:
      if (isCommit == 0) {
        nTruncate_01 = 0;
      }
      else {
        nTruncate_01 = 0;
        if (pPVar16->pDirty == (PgHdr *)0x0) {
          nTruncate_01 = nTruncate;
        }
      }
LAB_0015b1de:
      iVar5 = walWriteOneFrame(&w,pPVar16,nTruncate_01,lVar17);
      if (iVar5 != 0) {
        return iVar5;
      }
      local_d0 = (ulong)(uVar7 + 1);
      lVar17 = lVar17 + lVar10;
      *(byte *)&pPVar16->flags = (byte)pPVar16->flags | 0x40;
      local_c0 = pPVar16;
    }
    else {
      if ((isCommit != 0) && (nTruncate_01 = nTruncate, pPVar16->pDirty == (PgHdr *)0x0))
      goto LAB_0015b1de;
      _salt1 = _salt1 & 0xffffffff00000000;
      sqlite3WalFindFrame(pWal,pPVar16->pgno,&salt1);
      if (salt1 < uVar6) goto LAB_0015b1c6;
      if (salt1 <= pWal->iReCksum - 1) {
        pWal->iReCksum = salt1;
      }
      iVar5 = (*pWal->pWalFd->pMethods->xWrite)
                        (pWal->pWalFd,pPVar16->pData,uVar9,(ulong)(salt1 - 1) * lVar10 + 0x38);
      if (iVar5 != 0) {
        return iVar5;
      }
      *(byte *)&pPVar16->flags = (byte)pPVar16->flags & 0xbf;
    }
  }
  if (isCommit == 0) {
    iVar5 = 0;
    iVar8 = 0;
    goto LAB_0015b626;
  }
  if (pWal->iReCksum != 0) {
    lVar14 = (long)(int)pWal->szPage + 0x18;
    iVar5 = (int)lVar14;
    p = (u8 *)sqlite3_malloc(iVar5);
    if (p == (u8 *)0x0) {
      return 7;
    }
    if (pWal->iReCksum == 1) {
      sVar12 = 0x18;
      local_88 = lVar14;
    }
    else {
      local_88 = (long)iVar5;
      sVar12 = (ulong)(pWal->iReCksum - 2) * local_88 + 0x30;
    }
    iVar8 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,sVar12);
    uVar9 = sqlite3Get4byte(p);
    (pWal->hdr).aFrameCksum[0] = uVar9;
    local_68 = p + 4;
    uVar9 = sqlite3Get4byte(local_68);
    (pWal->hdr).aFrameCksum[1] = uVar9;
    uVar9 = pWal->iReCksum;
    pWal->iReCksum = 0;
    local_70 = p + 0x18;
    for (; (iVar8 == 0 && (uVar9 <= uVar7)); uVar9 = uVar9 + 1) {
      lVar14 = (ulong)(uVar9 - 1) * local_88 + 0x20;
      iVar8 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar5,lVar14);
      if (iVar8 == 0) {
        iPage = sqlite3Get4byte(p);
        nTruncate_00 = sqlite3Get4byte(local_68);
        walEncodeFrame(pWal,iPage,nTruncate_00,local_70,(u8 *)&salt1);
        iVar8 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&salt1,0x18,lVar14);
      }
    }
    sqlite3_free(p);
    if (iVar8 != 0) {
      return iVar8;
    }
  }
  if ((bVar1 & 3) == 0) {
    iVar8 = 0;
LAB_0015b5ea:
    iVar5 = 0;
  }
  else {
    if (pWal->padToSectorBoundary == '\0') {
      iVar8 = 0;
    }
    else {
      uVar6 = sqlite3SectorSize(pWal->pWalFd);
      lVar13 = lVar17 + (ulong)uVar6 + -1;
      lVar13 = lVar13 - lVar13 % (long)(ulong)uVar6;
      iVar8 = 0;
      w.iSyncPoint = lVar13;
      for (lVar14 = lVar17; lVar14 < lVar13; lVar14 = lVar14 + lVar10) {
        iVar5 = walWriteOneFrame(&w,local_c0,nTruncate,lVar14);
        if (iVar5 != 0) {
          return iVar5;
        }
        iVar8 = iVar8 + 1;
      }
      if (lVar13 != lVar17) goto LAB_0015b5ea;
    }
    iVar5 = (*local_78->pMethods->xSync)(local_78,bVar1 & 3);
  }
  if ((pWal->truncateOnCommit != '\0') && (lVar17 = pWal->mxWalSize, -1 < lVar17)) {
    lVar10 = lVar10 * (ulong)(uVar7 + iVar8) + 0x20;
    if (lVar10 <= lVar17) {
      lVar10 = lVar17;
    }
    walLimitSize(pWal,lVar10);
    pWal->truncateOnCommit = '\0';
  }
LAB_0015b626:
  uVar9 = (pWal->hdr).mxFrame;
  pPVar16 = pPVar15;
  while ((pPVar16 != (PgHdr *)0x0 && (iVar5 == 0))) {
    iVar5 = 0;
    if ((pPVar16->flags & 0x40) != 0) {
      uVar9 = uVar9 + 1;
      iVar5 = walIndexAppend(pWal,uVar9,pPVar16->pgno);
    }
    pPVar16 = pPVar16->pDirty;
  }
  for (; (iVar5 == 0 && (0 < iVar8)); iVar8 = iVar8 + -1) {
    uVar9 = uVar9 + 1;
    iVar5 = walIndexAppend(pWal,uVar9,local_c0->pgno);
  }
  if (iVar5 == 0) {
    (pWal->hdr).szPage = (ushort)((ulong)iVar2 >> 0x10) | (ushort)iVar2 & 0xff00;
    (pWal->hdr).mxFrame = uVar9;
    if (isCommit != 0) {
      puVar3 = &(pWal->hdr).iChange;
      *puVar3 = *puVar3 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar9;
    }
    pPVar4 = local_60;
    iVar5 = 0;
    if (local_60->pBackup != (sqlite3_backup *)0x0) {
      for (; pPVar15 != (PgHdr *)0x0; pPVar15 = pPVar15->pDirty) {
        sqlite3BackupUpdate(pPVar4->pBackup,pPVar15->pgno,(u8 *)pPVar15->pData);
      }
    }
  }
  return iVar5;
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal,
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}